

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O1

int ini_find_property(ini_t *ini,int section,char *name,int name_length)

{
  int iVar1;
  ini_internal_property_t *piVar2;
  int iVar3;
  char *__s2;
  int iVar4;
  long lVar5;
  
  if ((((-1 < section) && (ini != (ini_t *)0x0)) && (name != (char *)0x0)) &&
     (section < ini->section_count)) {
    if (name_length < 1) {
      name_length = sx_strlen(name);
    }
    iVar1 = ini->property_capacity;
    if (0 < (long)iVar1) {
      piVar2 = ini->properties;
      lVar5 = 0;
      iVar4 = 0;
      do {
        if (*(int *)(piVar2->name + lVar5 + -4) == section) {
          __s2 = piVar2->name + lVar5;
          if (*(char **)(piVar2->value + lVar5 + -8) != (char *)0x0) {
            __s2 = *(char **)(piVar2->value + lVar5 + -8);
          }
          iVar3 = strncasecmp(name,__s2,(long)name_length);
          if (iVar3 == 0) {
            return iVar4;
          }
          iVar4 = iVar4 + (uint)(iVar3 != 0);
        }
        lVar5 = lVar5 + 0x78;
      } while ((long)iVar1 * 0x78 - lVar5 != 0);
    }
  }
  return -1;
}

Assistant:

int ini_find_property( ini_t const* ini, int section, char const* name, int name_length )
    {
    int i;
    int c;

    if( ini && name && section >= 0 && section < ini->section_count)
        {
        if( name_length <= 0 ) name_length = (int) INI_STRLEN( name );
        c = 0;
        for( i = 0; i < ini->property_capacity; ++i )
            {
            if( ini->properties[ i ].section == section )
                {
                char const* const other = 
                    ini->properties[ i ].name_large ? ini->properties[ i ].name_large : ini->properties[ i ].name;
                if( INI_STRNICMP( name, other, name_length ) == 0 )
                    return c;
                ++c;
                }
            }
        }

    return INI_NOT_FOUND;
    }